

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorImpl<unsigned_int> * __thiscall
llvm::SmallVectorImpl<unsigned_int>::operator=
          (SmallVectorImpl<unsigned_int> *this,SmallVectorImpl<unsigned_int> *RHS)

{
  uint uVar1;
  uint uVar2;
  SmallVectorImpl<unsigned_int> *__ptr;
  long lVar3;
  SmallVectorImpl<unsigned_int> *__src;
  ulong uVar4;
  
  if (this == RHS) {
    return this;
  }
  __src = (SmallVectorImpl<unsigned_int> *)
          (RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
  if (__src != RHS + 1) {
    __ptr = (SmallVectorImpl<unsigned_int> *)
            (this->super_SmallVectorTemplateBase<unsigned_int,_true>).
            super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
    if (__ptr != this + 1) {
      free(__ptr);
      __src = (SmallVectorImpl<unsigned_int> *)
              (RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
              super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX;
    }
    (this->super_SmallVectorTemplateBase<unsigned_int,_true>).
    super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX = __src;
    uVar1 = (RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
            super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity;
    (this->super_SmallVectorTemplateBase<unsigned_int,_true>).
    super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size =
         (RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
         super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
    (this->super_SmallVectorTemplateBase<unsigned_int,_true>).
    super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity = uVar1;
    (RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
    super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX = RHS + 1;
    (RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
    super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity = 0;
    goto LAB_00d7644d;
  }
  uVar1 = (RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  uVar2 = (this->super_SmallVectorTemplateBase<unsigned_int,_true>).
          super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size;
  uVar4 = (ulong)uVar2;
  if (uVar2 < uVar1) {
    if ((this->super_SmallVectorTemplateBase<unsigned_int,_true>).
        super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity < uVar1)
    {
      (this->super_SmallVectorTemplateBase<unsigned_int,_true>).
      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size = 0;
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,(ulong)uVar1,4);
LAB_00d7641e:
      uVar4 = 0;
    }
    else {
      if (uVar4 == 0) goto LAB_00d7641e;
      memmove((this->super_SmallVectorTemplateBase<unsigned_int,_true>).
              super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,__src
              ,uVar4 * 4);
    }
    lVar3 = (RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
            super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size - uVar4;
    if (lVar3 != 0) {
      memcpy((void *)(uVar4 * 4 +
                     (long)(this->super_SmallVectorTemplateBase<unsigned_int,_true>).
                           super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase
                           .BeginX),
             (void *)((long)(RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
                            super_SmallVectorTemplateCommon<unsigned_int,_void>.
                            super_SmallVectorBase.BeginX + uVar4 * 4),lVar3 * 4);
    }
  }
  else if (uVar1 != 0) {
    memmove((this->super_SmallVectorTemplateBase<unsigned_int,_true>).
            super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX,__src,
            (ulong)uVar1 * 4);
  }
  if ((this->super_SmallVectorTemplateBase<unsigned_int,_true>).
      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity < uVar1) {
    __assert_fail("N <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
  }
  (this->super_SmallVectorTemplateBase<unsigned_int,_true>).
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size = uVar1;
LAB_00d7644d:
  (RHS->super_SmallVectorTemplateBase<unsigned_int,_true>).
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size = 0;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}